

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_error_code_e
ktxTexture2_loadImageDataInt
          (ktxTexture2 *This,ktx_uint8_t *pBuffer,ktx_size_t bufSize,
          ktxTexture2InflateFlagEnum inflateHandling)

{
  ktxStream *pkVar1;
  ktxTexture_protected *pkVar2;
  ktxTexture2_private *pkVar3;
  ktx_error_code_e kVar4;
  size_t __size;
  ktx_uint8_t *pInflatedData;
  ktx_uint8_t *pDeflatedData;
  ktx_uint8_t *pkVar5;
  bool bVar6;
  
  if (This->pData != (ktx_uint8_t *)0x0) {
    return KTX_INVALID_OPERATION;
  }
  pkVar2 = This->_protected;
  if ((pkVar2->_stream).data.file == (FILE *)0x0) {
    return KTX_INVALID_OPERATION;
  }
  pkVar3 = This->_private;
  if (inflateHandling == LOADDATA_INFLATE_ON_LOAD) {
    __size = ktxTexture2_GetDataSizeUncompressed(This);
    bVar6 = (This->supercompressionScheme & ~KTX_SS_BASIS_LZ) == KTX_SS_ZSTD;
  }
  else {
    __size = This->dataSize;
    bVar6 = false;
  }
  if (pBuffer == (ktx_uint8_t *)0x0) {
    pInflatedData = (ktx_uint8_t *)malloc(__size);
    This->pData = pInflatedData;
    if (pInflatedData == (ktx_uint8_t *)0x0) {
      return KTX_OUT_OF_MEMORY;
    }
  }
  else {
    pInflatedData = pBuffer;
    if (bufSize < __size) {
      return KTX_INVALID_VALUE;
    }
  }
  if (bVar6) {
    pDeflatedData = (ktx_uint8_t *)malloc(This->dataSize);
    pkVar5 = pDeflatedData;
    if (pDeflatedData == (ktx_uint8_t *)0x0) {
      return KTX_OUT_OF_MEMORY;
    }
  }
  else {
    pDeflatedData = (ktx_uint8_t *)0x0;
    pkVar5 = pInflatedData;
  }
  pkVar1 = &pkVar2->_stream;
  kVar4 = (*(pkVar2->_stream).setpos)(pkVar1,pkVar3->_firstLevelFileOffset);
  if ((kVar4 != KTX_SUCCESS) ||
     (kVar4 = (*pkVar1->read)(pkVar1,pkVar5,This->dataSize), kVar4 != KTX_SUCCESS))
  goto LAB_001eae66;
  if (bVar6) {
    if (pDeflatedData == (ktx_uint8_t *)0x0) {
      __assert_fail("pDeflatedData != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                    ,0xa30,
                    "ktx_error_code_e ktxTexture2_loadImageDataInt(ktxTexture2 *, ktx_uint8_t *, ktx_size_t, ktxTexture2InflateFlagEnum)"
                   );
    }
    if (This->supercompressionScheme == KTX_SS_END_RANGE) {
      kVar4 = ktxTexture2_inflateZLIBInt(This,pDeflatedData,pInflatedData,__size);
    }
    else {
      if (This->supercompressionScheme != KTX_SS_ZSTD) goto LAB_001eaed8;
      kVar4 = ktxTexture2_inflateZstdInt(This,pDeflatedData,pInflatedData,__size);
    }
    if (kVar4 != KTX_SUCCESS) {
      if (pBuffer == (ktx_uint8_t *)0x0) {
        free(This->pData);
        This->pData = (ktx_uint8_t *)0x0;
      }
      goto LAB_001eae66;
    }
  }
LAB_001eaed8:
  (*(pkVar2->_stream).destruct)(pkVar1);
  pkVar3->_firstLevelFileOffset = 0;
  kVar4 = KTX_SUCCESS;
LAB_001eae66:
  free(pDeflatedData);
  return kVar4;
}

Assistant:

ktx_error_code_e
ktxTexture2_loadImageDataInt(ktxTexture2* This,
                             ktx_uint8_t* pBuffer, ktx_size_t bufSize,
                             ktxTexture2InflateFlagEnum inflateHandling)
{
    DECLARE_PROTECTED(ktxTexture);
    DECLARE_PRIVATE(ktxTexture2);
    ktx_uint8_t*    pDest;
    ktx_uint8_t*    pDeflatedData = NULL;
    ktx_uint8_t*    pReadBuf;
    KTX_error_code  result = KTX_SUCCESS;
    ktx_size_t outputDataCapacity;
    ktx_bool_t doInflate = false;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->pData != NULL)
        return KTX_INVALID_OPERATION; // Data already loaded.

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images already loaded;
        return KTX_INVALID_OPERATION;

    if (inflateHandling == LOADDATA_INFLATE_ON_LOAD) {
        outputDataCapacity = ktxTexture2_GetDataSizeUncompressed(This);
        if (This->supercompressionScheme == KTX_SS_ZSTD || This->supercompressionScheme == KTX_SS_ZLIB)
            doInflate = true;
    } else {
        outputDataCapacity = This->dataSize;
    }

    if (pBuffer == NULL) {
        This->pData = malloc(outputDataCapacity);
        if (This->pData == NULL)
            return KTX_OUT_OF_MEMORY;
        pDest = This->pData;
    } else if (bufSize < outputDataCapacity) {
        return KTX_INVALID_VALUE;
    } else {
        pDest = pBuffer;
    }

    if (doInflate) {
        // Create buffer to hold deflated data.
        pDeflatedData = malloc(This->dataSize);
        if (pDeflatedData == NULL)
            return KTX_OUT_OF_MEMORY;
        pReadBuf = pDeflatedData;
    } else {
        pReadBuf = pDest;
    }

    // Seek to data for first level as there may be padding between the
    // metadata/sgd and the image data.

    result = prtctd->_stream.setpos(&prtctd->_stream,
                                    private->_firstLevelFileOffset);
    if (result != KTX_SUCCESS)
        goto cleanup;

    result = prtctd->_stream.read(&prtctd->_stream, pReadBuf,
                                  This->dataSize);
    if (result != KTX_SUCCESS)
        goto cleanup;

    if (doInflate) {
        assert(pDeflatedData != NULL);
        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            result = ktxTexture2_inflateZstdInt(This, pDeflatedData, pDest,
                                                outputDataCapacity);
        } else if (This->supercompressionScheme == KTX_SS_ZLIB) {
            result = ktxTexture2_inflateZLIBInt(This, pDeflatedData, pDest,
                                                outputDataCapacity);
        }
        if (result != KTX_SUCCESS) {
            if (pBuffer == NULL) {
                free(This->pData);
                This->pData = 0;
            }
            goto cleanup;
        }
    }

    if (IS_BIG_ENDIAN) {
        // Perform endianness conversion on texture data.
        // To avoid mip padding, need to convert each level individually.
        for (ktx_uint32_t level = 0; level < This->numLevels; ++level)
        {
            ktx_size_t levelOffset;
            ktx_size_t levelByteLength;

            levelByteLength = private->_levelIndex[level].byteLength;
            levelOffset = ktxTexture2_levelDataOffset(This, level);
            pDest = This->pData + levelOffset;
            switch (prtctd->_typeSize) {
              case 2:
                _ktxSwapEndian16((ktx_uint16_t*)pDest, levelByteLength / 2);
                break;
              case 4:
                _ktxSwapEndian32((ktx_uint32_t*)pDest, levelByteLength / 4);
                break;
              case 8:
                _ktxSwapEndian64((ktx_uint64_t*)pDest, levelByteLength / 8);
                break;
            }
        }
    }

    // No further need for stream or file offset.
    prtctd->_stream.destruct(&prtctd->_stream);
    private->_firstLevelFileOffset = 0;

cleanup:
    free(pDeflatedData);

    return result;
}